

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

NodeAndBucket __thiscall
google::protobuf::internal::KeyMapBase<unsigned_int>::FindHelper
          (KeyMapBase<unsigned_int> *this,ViewType k)

{
  map_index_t mVar1;
  uint uVar2;
  NodeAndBucket NVar3;
  KeyMapBase<unsigned_int> *local_30;
  NodeBase *node;
  map_index_t b;
  ViewType k_local;
  KeyMapBase<unsigned_int> *this_local;
  
  AssertLoadFactor(this);
  mVar1 = BucketNumber(this,k);
  local_30 = (KeyMapBase<unsigned_int> *)(this->super_UntypedMapBase).table_[mVar1];
  do {
    if (local_30 == (KeyMapBase<unsigned_int> *)0x0) {
      this_local = (KeyMapBase<unsigned_int> *)0x0;
LAB_008c88c9:
      NVar3.bucket = mVar1;
      NVar3.node = (NodeBase *)this_local;
      NVar3._12_4_ = 0;
      return NVar3;
    }
    uVar2 = KeyNode<unsigned_int>::key((KeyNode<unsigned_int> *)local_30);
    uVar2 = TransparentSupport<unsigned_int>::ToView(uVar2);
    if (uVar2 == k) {
      this_local = local_30;
      goto LAB_008c88c9;
    }
    local_30 = *(KeyMapBase<unsigned_int> **)&local_30->super_UntypedMapBase;
  } while( true );
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k) const {
    AssertLoadFactor();
    map_index_t b = BucketNumber(k);
    for (auto* node = table_[b]; node != nullptr; node = node->next) {
      if (TS::ToView(static_cast<KeyNode*>(node)->key()) == k) {
        return {node, b};
      }
    }
    return {nullptr, b};
  }